

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

TiXmlNode * __thiscall TiXmlNode::IterateChildren(TiXmlNode *this,char *val,TiXmlNode *previous)

{
  TiXmlNode *previous_local;
  char *val_local;
  TiXmlNode *this_local;
  
  if (previous == (TiXmlNode *)0x0) {
    this_local = FirstChild(this,val);
  }
  else {
    if (previous->parent != this) {
      __assert_fail("previous->parent == this",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/luckynote[P]ibug_300W_make_landmarks_tools/src/tinyXML/tinyxml.cpp"
                    ,0x197,
                    "const TiXmlNode *TiXmlNode::IterateChildren(const char *, const TiXmlNode *) const"
                   );
    }
    this_local = NextSibling(previous,val);
  }
  return this_local;
}

Assistant:

const TiXmlNode* TiXmlNode::IterateChildren( const char * val, const TiXmlNode* previous ) const
{
	if ( !previous )
	{
		return FirstChild( val );
	}
	else
	{
		assert( previous->parent == this );
		return previous->NextSibling( val );
	}
}